

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.cpp
# Opt level: O2

void __thiscall
embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleMi<4>_>::
setupLargeBuildRefBuilder
          (BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleMi<4>_> *this,
          size_t objectID,TriangleMesh *mesh)

{
  ushort uVar1;
  long *plVar2;
  Builder *pBVar3;
  char cVar4;
  long lVar5;
  undefined8 *puVar6;
  Builder *builder;
  
  if ((((*(long *)(*(long *)(*(long *)(this + 0x28) + 0x200) + objectID * 8) != 0) &&
       (plVar2 = *(long **)(*(long *)(this + 0x10) + objectID * 8),
       cVar4 = (**(code **)(*plVar2 + 0x18))
                         (plVar2,*(ushort *)&(mesh->super_Geometry).field_8.field_0x2 & 7),
       cVar4 == '\0')) && (lVar5 = *(long *)(*(long *)(this + 0x10) + objectID * 8), lVar5 != 0)) &&
     (lVar5 = __dynamic_cast(lVar5,&BVHNBuilderTwoLevel<4,embree::TriangleMesh,embree::TriangleMi<4>>
                                    ::RefBuilderBase::typeinfo,
                             &BVHNBuilderTwoLevel<4,embree::TriangleMesh,embree::TriangleMi<4>>::
                              RefBuilderLarge::typeinfo,0), lVar5 != 0)) {
    return;
  }
  builder = (Builder *)0x0;
  plVar2 = *(long **)(*(long *)(*(long *)(this + 0x28) + 0x200) + objectID * 8);
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 8))();
  }
  createMeshAccel(this,objectID,&builder);
  lVar5 = *(long *)(this + 0x10);
  puVar6 = (undefined8 *)::operator_new(0x20);
  pBVar3 = builder;
  if (builder != (Builder *)0x0) {
    (*(builder->super_RefCount)._vptr_RefCount[2])(builder);
  }
  uVar1 = *(ushort *)&(mesh->super_Geometry).field_8.field_0x2;
  *puVar6 = &PTR__RefBuilderLarge_021df580;
  puVar6[1] = objectID;
  puVar6[2] = pBVar3;
  if (pBVar3 != (Builder *)0x0) {
    (*(pBVar3->super_RefCount)._vptr_RefCount[2])(pBVar3);
  }
  *(uint *)(puVar6 + 3) = uVar1 & 7;
  plVar2 = *(long **)(lVar5 + objectID * 8);
  *(undefined8 **)(lVar5 + objectID * 8) = puVar6;
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 8))();
  }
  if (pBVar3 != (Builder *)0x0) {
    (*(pBVar3->super_RefCount)._vptr_RefCount[3])(pBVar3);
  }
  return;
}

Assistant:

void BVHNBuilderTwoLevel<N,Mesh,Primitive>::setupLargeBuildRefBuilder (size_t objectID, Mesh const * const mesh)
    {
      if (bvh->objects[objectID] == nullptr ||                                  // new mesh
          builders[objectID]->meshQualityChanged (mesh->quality) ||             // changed build quality
          dynamic_cast<RefBuilderLarge*>(builders[objectID].get()) == nullptr)  // size change resulted in small->large change
      {
        Builder* builder = nullptr;
        delete bvh->objects[objectID]; 
        createMeshAccel(objectID, builder);
        builders[objectID].reset (new RefBuilderLarge(objectID, builder, mesh->quality));
      }
    }